

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::CreateFieldSrcValue
          (GlobOpt *this,PropertySym *sym,PropertySym *originalSym,Opnd **ppOpnd,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Value *pVVar6;
  
  bVar2 = IR::Instr::UsesAllFields(instr);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x266,"(!instr->UsesAllFields())","!instr->UsesAllFields()");
    if (!bVar2) goto LAB_0049a9fc;
    *puVar5 = 0;
  }
  AssertCanCopyPropOrCSEFieldLoad(instr);
  if (instr->m_src1 != *ppOpnd) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x26a,"(instr->GetSrc1() == *ppOpnd)","instr->GetSrc1() == *ppOpnd");
    if (!bVar2) goto LAB_0049a9fc;
    *puVar5 = 0;
  }
  bVar2 = DoFieldCopyProp(this);
  if (!bVar2) {
    return (Value *)0x0;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                    ((this->currentBlock->globOptData).liveFields,(sym->super_Sym).m_id);
  if (sym != originalSym) {
    BVSparse<Memory::JitArenaAllocator>::TestAndSet
              ((this->currentBlock->globOptData).liveFields,(originalSym->super_Sym).m_id);
  }
  if (BVar3 == '\0') {
    GlobOptBlockData::ClearSymValue(&this->currentBlock->globOptData,&sym->super_Sym);
    GlobOptBlockData::ClearSymValue(&this->currentBlock->globOptData,&originalSym->super_Sym);
  }
  this_00 = *ppOpnd;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar2) goto LAB_0049a9fc;
    *puVar5 = 0;
  }
  if (((PropertySym *)this_00[1]._vptr_Opnd != sym) && (this->prePassLoop == (Loop *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x285,"((*ppOpnd)->AsSymOpnd()->m_sym == sym || this->IsLoopPrePass())",
                       "(*ppOpnd)->AsSymOpnd()->m_sym == sym || this->IsLoopPrePass()");
    if (!bVar2) {
LAB_0049a9fc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pVVar6 = NewGenericValue(this,(ValueType)0x9,*ppOpnd);
  return pVVar6;
}

Assistant:

Value *
GlobOpt::CreateFieldSrcValue(PropertySym * sym, PropertySym * originalSym, IR::Opnd ** ppOpnd, IR::Instr * instr)
{
#if DBG
    // If the opcode going to kill all field values immediate anyway, we shouldn't be giving it a value
    Assert(!instr->UsesAllFields());

    AssertCanCopyPropOrCSEFieldLoad(instr);

    Assert(instr->GetSrc1() == *ppOpnd);
#endif

    // Only give a value to fields if we are doing field copy prop.
    // Consider: We should always copy prop local slots, but the only use right now is LdSlot from jit loop body.
    // This should have one onus load, and thus no need for copy prop of field itself.  We may want to support
    // copy prop LdSlot if there are other uses of local slots
    if (!this->DoFieldCopyProp())
    {
        return nullptr;
    }

    BOOL wasLive = this->currentBlock->globOptData.liveFields->TestAndSet(sym->m_id);

    if (sym != originalSym)
    {
        this->currentBlock->globOptData.liveFields->TestAndSet(originalSym->m_id);
    }

    if (!wasLive)
    {
        // We don't clear the value when we kill the field.
        // Clear it to make sure we don't use the old value.
        this->currentBlock->globOptData.ClearSymValue(sym);
        this->currentBlock->globOptData.ClearSymValue(originalSym);
    }

    Assert((*ppOpnd)->AsSymOpnd()->m_sym == sym || this->IsLoopPrePass());

    // We don't use the sym store to do copy prop on hoisted fields, but create a value
    // in case it can be copy prop out of the loop.
    return this->NewGenericValue(ValueType::Uninitialized, *ppOpnd);
}